

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall embree::SceneGraph::PlyParser::import(PlyParser *this)

{
  atomic<unsigned_long> *paVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
  *this_00;
  pointer *ppTVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer pvVar6;
  Vec3fa *ptr;
  unsigned_long uVar7;
  iterator __position;
  undefined8 uVar8;
  unsigned_long uVar9;
  PlyParser *pPVar10;
  Node *this_01;
  TriangleMeshNode *this_02;
  mapped_type *pmVar11;
  Vec3fa *pVVar12;
  long lVar13;
  mapped_type *pmVar14;
  pointer pvVar15;
  ulong uVar16;
  pointer puVar17;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>_>_>
  *this_03;
  long in_RSI;
  uint uVar18;
  unsigned_long uVar19;
  size_t k;
  ulong uVar20;
  ulong uVar21;
  key_type local_a8;
  mapped_type *local_88;
  mapped_type *local_80;
  Ref<embree::SceneGraph::MaterialNode> local_78;
  Node *local_70;
  PlyParser *local_68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>_>_>
  *local_60;
  mapped_type *local_58;
  string local_50;
  
  this_01 = (Node *)alignedUSMMalloc(0x180,0x10,DEVICE_READ_ONLY);
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  Node::Node(this_01,&local_50);
  (this_01->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__OBJMaterial_002c1bc0;
  *(undefined4 *)&this_01[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined4 *)&this_01[1].fileName._M_string_length = 0;
  *(undefined8 *)((long)&this_01[1].fileName._M_string_length + 4) = 0x3f8000003f800000;
  *(undefined4 *)((long)&this_01[1].fileName.field_2 + 4) = 0x3f800000;
  *(undefined8 *)((long)&this_01[1].fileName.field_2 + 8) = 0;
  this_01[1].name._M_dataplus._M_p = (pointer)0x0;
  this_01[1].name._M_string_length = 0x3f8000003f800000;
  this_01[1].name.field_2._M_allocated_capacity = 0x3f8000003f800000;
  *(undefined8 *)((long)&this_01[1].name.field_2 + 8) = 0;
  this_01[1].indegree = 0;
  this_01[1].closed = false;
  this_01[1].hasLightOrCamera = false;
  *(undefined2 *)&this_01[1].field_0x5a = 0x3f80;
  this_01[1].id = 0x3f800000;
  this_01[1].geometry = (void *)0x3f8000003f800000;
  memset(this_01 + 2,0,0xa8);
  LOCK();
  paVar1 = &(this_01->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_70 = this_01;
  this_02 = (TriangleMeshNode *)operator_new(0xd8);
  local_78.ptr = (MaterialNode *)this_01;
  (*(this_01->super_RefCount)._vptr_RefCount[2])(this_01);
  TriangleMeshNode::TriangleMeshNode(this_02,&local_78,(BBox1f)0x3f80000000000000,1);
  (*(this_02->super_Node).super_RefCount._vptr_RefCount[2])(this_02);
  if (&(local_78.ptr)->super_Node != (Node *)0x0) {
    (*((local_78.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  this_03 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>_>_>
             *)(in_RSI + 0x228);
  local_a8.field_2._M_allocated_capacity._0_2_ = 0x6576;
  local_a8.field_2._M_allocated_capacity._2_2_ = 0x7472;
  local_a8.field_2._M_local_buf[4] = 'e';
  local_a8.field_2._M_local_buf[5] = 'x';
  local_a8._M_string_length = 6;
  local_a8.field_2._M_local_buf[6] = '\0';
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_88 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>_>_>
             ::at(this_03,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  this_00 = &local_88->data;
  local_a8.field_2._M_allocated_capacity._0_2_ = 0x78;
  local_a8._M_string_length = 1;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_80 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
             ::at(this_00,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8.field_2._M_allocated_capacity._0_2_ = 0x79;
  local_a8._M_string_length = 1;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_58 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
             ::at(this_00,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8.field_2._M_allocated_capacity._0_2_ = 0x7a;
  local_a8._M_string_length = 1;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
            ::at(this_00,&local_a8);
  local_60 = this_03;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  pvVar6 = (this_02->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar16 = local_88->size;
  uVar20 = pvVar6->size_alloced;
  uVar21 = uVar20;
  if ((uVar20 < uVar16) && (uVar21 = uVar16, uVar20 != 0)) {
    do {
      uVar20 = uVar20 * 2 + (ulong)(uVar20 * 2 == 0);
      uVar21 = uVar20;
    } while (uVar20 < uVar16);
  }
  if (uVar16 < pvVar6->size_active) {
    pvVar6->size_active = uVar16;
  }
  local_68 = this;
  if (pvVar6->size_alloced == uVar21) {
    pvVar6->size_active = uVar16;
  }
  else {
    ptr = pvVar6->items;
    pVVar12 = (Vec3fa *)alignedMalloc(uVar21 << 4,0x10);
    pvVar6->items = pVVar12;
    if (pvVar6->size_active != 0) {
      lVar13 = 0;
      uVar20 = 0;
      do {
        puVar3 = (undefined8 *)((long)&ptr->field_0 + lVar13);
        uVar8 = puVar3[1];
        puVar4 = (undefined8 *)((long)&pvVar6->items->field_0 + lVar13);
        *puVar4 = *puVar3;
        puVar4[1] = uVar8;
        uVar20 = uVar20 + 1;
        lVar13 = lVar13 + 0x10;
      } while (uVar20 < pvVar6->size_active);
    }
    alignedFree(ptr);
    pvVar6->size_active = uVar16;
    pvVar6->size_alloced = uVar21;
  }
  if (local_88->size != 0) {
    lVar13 = 0;
    uVar16 = 0;
    do {
      *(float *)((long)&((this_02->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar13) =
           (local_80->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar16];
      *(float *)((long)&((this_02->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar13 + 4) =
           (local_58->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar16];
      *(float *)((long)&((this_02->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar13 + 8) =
           (pmVar11->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar16];
      uVar16 = uVar16 + 1;
      lVar13 = lVar13 + 0x10;
    } while (uVar16 < local_88->size);
  }
  paVar5 = &local_a8.field_2;
  local_a8.field_2._M_allocated_capacity._0_2_ = 0x6166;
  local_a8.field_2._M_allocated_capacity._2_2_ = 0x6563;
  local_a8._M_string_length = 4;
  local_a8.field_2._M_local_buf[4] = '\0';
  local_a8._M_dataplus._M_p = (pointer)paVar5;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>_>_>
            ::at(local_60,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar5) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8.field_2._M_allocated_capacity._0_2_ = 0x6576;
  local_a8.field_2._M_allocated_capacity._2_2_ = 0x7472;
  local_a8.field_2._M_local_buf[4] = 'e';
  local_a8.field_2._M_local_buf[5] = 'x';
  local_a8.field_2._M_local_buf[6] = '_';
  local_a8.field_2._M_local_buf[7] = 'i';
  local_a8.field_2._8_6_ = 0x73656369646e;
  local_a8._M_string_length = 0xe;
  local_a8.field_2._M_local_buf[0xe] = '\0';
  local_a8._M_dataplus._M_p = (pointer)paVar5;
  local_80 = (mapped_type *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
             ::at(&pmVar14->list,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar5) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  pvVar15 = (((_Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)&local_80->super__Vector_base<float,_std::allocator<float>_>)->_M_impl).
            super__Vector_impl_data._M_start;
  if ((((_Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         *)&local_80->super__Vector_base<float,_std::allocator<float>_>)->_M_impl).
      super__Vector_impl_data._M_finish != pvVar15) {
    local_88 = (mapped_type *)&this_02->triangles;
    uVar16 = 0;
    do {
      puVar17 = pvVar15[uVar16].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (0x10 < (ulong)((long)pvVar15[uVar16].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar17)) {
        uVar9 = *puVar17;
        uVar20 = 2;
        uVar19 = puVar17[1];
        do {
          uVar7 = puVar17[uVar20];
          local_a8._M_dataplus._M_p._4_4_ = (int)uVar19;
          local_a8._M_dataplus._M_p._0_4_ = (int)uVar9;
          uVar18 = (uint)uVar7;
          local_a8._M_string_length = CONCAT44(local_a8._M_string_length._4_4_,uVar18);
          __position._M_current =
               (this_02->triangles).
               super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this_02->triangles).
              super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
            ::_M_realloc_insert<embree::SceneGraph::TriangleMeshNode::Triangle>
                      ((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                        *)local_88,__position,(Triangle *)&local_a8);
          }
          else {
            (__position._M_current)->v2 = uVar18;
            *(pointer *)__position._M_current = local_a8._M_dataplus._M_p;
            ppTVar2 = &(this_02->triangles).
                       super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppTVar2 = *ppTVar2 + 1;
          }
          uVar20 = uVar20 + 1;
          puVar17 = pvVar15[uVar16].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar19 = uVar7;
        } while (uVar20 < (ulong)((long)pvVar15[uVar16].
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar17
                                 >> 3));
      }
      uVar16 = uVar16 + 1;
      pvVar15 = (((_Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)&local_80->super__Vector_base<float,_std::allocator<float>_>)->_M_impl).
                super__Vector_impl_data._M_start;
    } while (uVar16 < (ulong)(((long)(((_Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                        *)&local_80->
                                           super__Vector_base<float,_std::allocator<float>_>)->
                                     _M_impl).super__Vector_impl_data._M_finish - (long)pvVar15 >> 3
                              ) * -0x5555555555555555));
  }
  pPVar10 = local_68;
  *(TriangleMeshNode **)local_68 = this_02;
  (*(this_02->super_Node).super_RefCount._vptr_RefCount[2])(this_02);
  (*(this_02->super_Node).super_RefCount._vptr_RefCount[3])(this_02);
  (*(local_70->super_RefCount)._vptr_RefCount[3])();
  return (Ref<embree::SceneGraph::Node>)(Node *)pPVar10;
}

Assistant:

Ref<SceneGraph::Node> import()
      {
        Ref<SceneGraph::MaterialNode> material = new OBJMaterial;
        Ref<SceneGraph::TriangleMeshNode> mesh_o = new SceneGraph::TriangleMeshNode(material,BBox1f(0,1),1);
        
        /* convert all vertices */
        const Element& vertices = mesh.elements.at("vertex");
        const std::vector<float>& posx = vertices.data.at("x");
        const std::vector<float>& posy = vertices.data.at("y");
        const std::vector<float>& posz = vertices.data.at("z");
        
        mesh_o->positions[0].resize(vertices.size);
        for (size_t i=0; i<vertices.size; i++) {
          mesh_o->positions[0][i].x = posx[i];
          mesh_o->positions[0][i].y = posy[i];
          mesh_o->positions[0][i].z = posz[i];
        }

        /* convert all faces */
        const Element& faces = mesh.elements.at("face");
        const std::vector<std::vector<size_t> >& polygons = faces.list.at("vertex_indices");
        
        for (size_t j=0; j<polygons.size(); j++)
        {
          const std::vector<size_t>& face = polygons[j];
          if (face.size() < 3) continue;
          
          /* triangulate the face with a triangle fan */
          size_t i0 = face[0], i1 = 0, i2 = face[1];
          for (size_t k=2; k<face.size(); k++) {
            i1 = i2; i2 = face[k];
            mesh_o->triangles.push_back(SceneGraph::TriangleMeshNode::Triangle((unsigned int)i0, (unsigned int)i1, (unsigned int)i2));
          }
        }
        return mesh_o.dynamicCast<SceneGraph::Node>();
      }